

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>
::construct<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,double>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,double>>>
           *this,slot_type *slot,piecewise_construct_t *args,tuple<int_&&> *args_1,tuple<> *args_2)

{
  size_t c;
  
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  (slot->value).first =
       *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>._M_head_impl;
  (slot->value).second = 0.0;
  CommonFields::set_capacity((CommonFields *)this,c);
  return;
}

Assistant:

size_t capacity() const { return capacity_; }